

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void ptls_buffer__release_memory(ptls_buffer_t *buf)

{
  ptls_buffer_t *buf_local;
  
  (*ptls_clear_memory)(buf->base,buf->off);
  if (buf->is_allocated != '\0') {
    free(buf->base);
  }
  return;
}

Assistant:

void ptls_buffer__release_memory(ptls_buffer_t *buf)
{
    ptls_clear_memory(buf->base, buf->off);
    if (buf->is_allocated) {
#ifdef _WINDOWS
        if (buf->align_bits != 0) {
            _aligned_free(buf->base);
        } else {
            free(buf->base);
        }
#else
        free(buf->base);
#endif
    }
}